

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdGen * Cudd_FirstNode(DdManager *dd,DdNode *f,DdNode **node)

{
  DdNode *pDVar1;
  int local_34;
  DdManager *pDStack_30;
  int size;
  DdGen *gen;
  DdNode **node_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if ((dd == (DdManager *)0x0) || (f == (DdNode *)0x0)) {
    dd_local = (DdManager *)0x0;
  }
  else {
    gen = (DdGen *)node;
    node_local = (DdNode **)f;
    f_local = &dd->sentinel;
    pDStack_30 = (DdManager *)malloc(0x38);
    if (pDStack_30 == (DdManager *)0x0) {
      *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
      dd_local = (DdManager *)0x0;
    }
    else {
      *(DdNode **)&pDStack_30->sentinel = f_local;
      *(undefined4 *)&(pDStack_30->sentinel).next = 2;
      *(undefined4 *)((long)&(pDStack_30->sentinel).next + 4) = 0;
      *(undefined4 *)&(pDStack_30->sentinel).Id = 0;
      pDStack_30->zero = (DdNode *)0x0;
      pDVar1 = (DdNode *)cuddNodeArray((DdNode *)((ulong)node_local & 0xfffffffffffffffe),&local_34)
      ;
      pDStack_30->one = pDVar1;
      if (pDStack_30->one == (DdNode *)0x0) {
        if (pDStack_30 != (DdManager *)0x0) {
          free(pDStack_30);
        }
        *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)&(pDStack_30->sentinel).type = local_34;
        if ((int)(pDStack_30->sentinel).Id < *(int *)&(pDStack_30->sentinel).type) {
          *(undefined4 *)((long)&(pDStack_30->sentinel).next + 4) = 1;
          pDStack_30->zero =
               *(DdNode **)(&pDStack_30->one->index + (long)(int)(pDStack_30->sentinel).Id * 2);
          gen->manager = (DdManager *)pDStack_30->zero;
        }
        dd_local = pDStack_30;
      }
    }
  }
  return (DdGen *)dd_local;
}

Assistant:

DdGen *
Cudd_FirstNode(
  DdManager * dd,
  DdNode * f,
  DdNode ** node)
{
    DdGen *gen;
    int size;

    /* Sanity Check. */
    if (dd == NULL || f == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = dd;
    gen->type = CUDD_GEN_NODES;
    gen->status = CUDD_GEN_EMPTY;
    gen->stack.sp = 0;
    gen->node = NULL;

    /* Collect all the nodes on the generator stack for later perusal. */
    gen->stack.stack = cuddNodeArray(Cudd_Regular(f), &size);
    if (gen->stack.stack == NULL) {
        ABC_FREE(gen);
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    gen->gen.nodes.size = size;

    /* Find the first node. */
    if (gen->stack.sp < gen->gen.nodes.size) {
        gen->status = CUDD_GEN_NONEMPTY;
        gen->node = gen->stack.stack[gen->stack.sp];
        *node = gen->node;
    }

    return(gen);

}